

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_vtk.cpp
# Opt level: O1

void Omega_h::vtk::write_vtu(ostream *stream,Mesh *mesh,Int cell_dim,TagSet *tags,bool compress)

{
  ulong *puVar1;
  int *piVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  _Rb_tree_header *p_Var4;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar5;
  _Rb_tree_node_base *name;
  Alloc *pAVar6;
  ulong uVar7;
  Mesh *pMVar8;
  TagSet *pTVar9;
  _Alloc_hider _Var10;
  bool bVar11;
  int iVar12;
  LO LVar13;
  Int IVar14;
  int iVar15;
  I32 IVar16;
  long *plVar17;
  undefined8 *puVar18;
  _Rb_tree_node_base *p_Var19;
  ostream *poVar20;
  const_iterator cVar21;
  Tag<long> *pTVar22;
  TagBase *pTVar23;
  string *psVar24;
  uint uVar25;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar26;
  byte value;
  uint uVar27;
  char *pcVar28;
  undefined8 uVar29;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var30;
  char *pcVar31;
  char *format;
  undefined7 in_register_00000081;
  ulong uVar32;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *psVar33;
  ScopedTimer omega_h_scoped_function_timer;
  Read<signed_char> types;
  string __str;
  LOs ends;
  Reals coords;
  undefined1 local_140 [24];
  undefined5 uStack_128;
  undefined3 uStack_123;
  uint local_11c;
  ostream *local_118;
  ScopedTimer local_109;
  ulong local_108;
  Mesh *local_100;
  TagSet *local_f8;
  key_type local_f0;
  undefined1 local_d0 [32];
  key_type local_b0;
  Read<int> local_90;
  Read<int> local_80;
  Read<int> local_70;
  Reals local_60;
  Alloc *local_50;
  element_type *local_48;
  Read<double> local_40;
  
  local_118 = stream;
  local_100 = mesh;
  local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_b0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_vtk.cpp"
             ,"");
  plVar17 = (long *)std::__cxx11::string::append((char *)&local_b0);
  paVar5 = &local_f0.field_2;
  paVar26 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(plVar17 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar17 == paVar26) {
    local_f0.field_2._M_allocated_capacity = paVar26->_M_allocated_capacity;
    local_f0.field_2._8_8_ = plVar17[3];
    local_f0._M_dataplus._M_p = (pointer)paVar5;
  }
  else {
    local_f0.field_2._M_allocated_capacity = paVar26->_M_allocated_capacity;
    local_f0._M_dataplus._M_p = (pointer)*plVar17;
  }
  local_f0._M_string_length = plVar17[1];
  *plVar17 = (long)paVar26;
  plVar17[1] = 0;
  *(undefined1 *)(plVar17 + 2) = 0;
  pAVar6 = (Alloc *)(local_d0 + 0x10);
  local_d0._0_8_ = pAVar6;
  std::__cxx11::string::_M_construct((ulong)local_d0,'\x03');
  std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_d0._0_8_,3,0x25c);
  p_Var3 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           ((long)(Library **)local_d0._8_8_ + local_f0._M_string_length);
  uVar29 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != paVar5) {
    uVar29 = local_f0.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar29 < p_Var3) {
    p_Var30 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0xf;
    if ((Alloc *)local_d0._0_8_ != pAVar6) {
      p_Var30 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d0._16_8_;
    }
    if (p_Var30 < p_Var3) goto LAB_00420308;
    puVar18 = (undefined8 *)
              std::__cxx11::string::replace
                        ((ulong)local_d0,0,(char *)0x0,(ulong)local_f0._M_dataplus._M_p);
  }
  else {
LAB_00420308:
    puVar18 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_f0,local_d0._0_8_);
  }
  local_140._0_8_ = local_140 + 0x10;
  puVar1 = puVar18 + 2;
  if ((ulong *)*puVar18 == puVar1) {
    local_140._16_8_ = *puVar1;
    _uStack_128 = puVar18[3];
  }
  else {
    local_140._16_8_ = *puVar1;
    local_140._0_8_ = (ulong *)*puVar18;
  }
  local_140._8_8_ = puVar18[1];
  *puVar18 = puVar1;
  puVar18[1] = 0;
  *(char *)puVar1 = '\0';
  begin_code("write_vtu",(char *)local_140._0_8_);
  if ((undefined1 *)local_140._0_8_ != local_140 + 0x10) {
    operator_delete((void *)local_140._0_8_,local_140._16_8_ + 1);
  }
  if ((Alloc *)local_d0._0_8_ != pAVar6) {
    operator_delete((void *)local_d0._0_8_,(ulong)((long)(_func_int ***)local_d0._16_8_ + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != paVar5) {
    operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._0_8_ + 1);
  }
  local_11c = (uint)CONCAT71(in_register_00000081,compress);
  local_f8 = tags;
  if ((cell_dim == -1) && (cell_dim = local_100->dim_, 3 < (uint)cell_dim)) {
    fail("assertion %s failed at %s +%d\n","0 <= dim_ && dim_ <= 3",
         "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_mesh.hpp"
         ,0x33);
  }
  local_108 = (ulong)(uint)cell_dim;
  uVar32 = 0;
  do {
    IVar14 = (Int)uVar32;
    if (uVar32 == 0 || uVar32 == local_108) {
      psVar33 = local_f8->_M_elems;
      for (p_Var19 = *(_Base_ptr *)
                      ((long)&local_f8->_M_elems[uVar32]._M_t._M_impl.super__Rb_tree_header.
                              _M_header + 0x10);
          (_Rb_tree_header *)p_Var19 != &psVar33[uVar32]._M_t._M_impl.super__Rb_tree_header;
          p_Var19 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var19)) {
        name = p_Var19 + 1;
        bVar11 = Omega_h::Mesh::has_tag(local_100,IVar14,(string *)name);
        if ((((!bVar11) && (iVar12 = std::__cxx11::string::compare((char *)name), iVar12 != 0)) &&
            (iVar12 = std::__cxx11::string::compare((char *)name), iVar12 != 0)) &&
           (iVar12 = std::__cxx11::string::compare((char *)name), iVar12 != 0)) {
          pcVar31 = *(char **)name;
          if (IVar14 - 1U < 3) {
            pcVar28 = (char *)(&DAT_004c6658)[IVar14 - 1U];
          }
          else {
            pcVar28 = (char *)0x0;
            if (uVar32 == 0) {
              pcVar28 = "vertices";
            }
          }
          format = 
          "User requested VTK output of tag %s on %s, but that tag doesn\'t exist on the mesh!";
          goto LAB_00421382;
        }
      }
    }
    else if (local_f8->_M_elems[uVar32]._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
      if (IVar14 - 1U < 3) {
        pcVar31 = (char *)(&DAT_004c6658)[IVar14 - 1U];
      }
      else {
        pcVar31 = (char *)0x0;
        if (uVar32 == 0) {
          pcVar31 = "vertices";
        }
      }
      uVar25 = (int)local_108 - 1;
      if (uVar25 < 3) {
        pcVar28 = (char *)(&DAT_004c6658)[uVar25];
      }
      else {
        pcVar28 = (char *)0x0;
        if (local_108 == 0) {
          pcVar28 = "vertices";
        }
      }
      format = "User requested VTK output of tags on %s, but only vertices and %s are output!";
LAB_00421382:
      fail(format,pcVar31,pcVar28);
    }
    uVar7 = local_108;
    uVar32 = uVar32 + 1;
  } while (uVar32 != 4);
  bVar11 = local_11c._0_1_;
  local_11c = local_11c & 0xff;
  write_vtkfile_vtu_start_tag(local_118,bVar11);
  pMVar8 = local_100;
  std::__ostream_insert<char,std::char_traits<char>>(local_118,"<UnstructuredGrid>\n",0x13);
  std::__ostream_insert<char,std::char_traits<char>>(local_118,"<Piece NumberOfPoints=\"",0x17);
  LVar13 = Omega_h::Mesh::nverts(pMVar8);
  poVar20 = (ostream *)std::ostream::operator<<((ostream *)local_118,LVar13);
  std::__ostream_insert<char,std::char_traits<char>>(poVar20,"\"",1);
  std::__ostream_insert<char,std::char_traits<char>>(local_118," NumberOfCells=\"",0x10);
  IVar14 = (Int)uVar7;
  LVar13 = Omega_h::Mesh::nents(pMVar8,IVar14);
  poVar20 = (ostream *)std::ostream::operator<<((ostream *)local_118,LVar13);
  std::__ostream_insert<char,std::char_traits<char>>(poVar20,"\">\n",3);
  std::__ostream_insert<char,std::char_traits<char>>(local_118,"<Cells>\n",8);
  LVar13 = Omega_h::Mesh::nents(pMVar8,IVar14);
  uVar25 = IVar14 - 1;
  if (pMVar8->family_ == OMEGA_H_SIMPLEX) {
    if (2 < uVar25) goto LAB_004205d8;
    uVar27 = 0xa0503;
  }
  else {
    if (2 < uVar25) {
LAB_004205d8:
      value = -(uVar7 != 0) | 1;
      goto LAB_004205e2;
    }
    uVar27 = 0xc0903;
  }
  value = (byte)(uVar27 >> ((char)uVar25 * '\b' & 0x1fU));
LAB_004205e2:
  local_140._8_8_ = 0;
  local_140._16_8_ = local_140._16_8_ & 0xffffffffffffff00;
  local_140._0_8_ = local_140 + 0x10;
  Read<signed_char>::Read((Read<signed_char> *)&local_f0,LVar13,value,(string *)local_140);
  if ((undefined1 *)local_140._0_8_ != local_140 + 0x10) {
    operator_delete((void *)local_140._0_8_,local_140._16_8_ + 1);
  }
  uVar32 = local_108;
  local_140._0_8_ = local_140 + 0x10;
  local_140._16_6_ = 0x7365707974;
  local_140._8_8_ = 5;
  local_b0._M_dataplus._M_p = local_f0._M_dataplus._M_p;
  if (((ulong)local_f0._M_dataplus._M_p & 7) == 0 &&
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)0x0) {
    if (entering_parallel == '\x01') {
      local_b0._M_dataplus._M_p = (pointer)(*(size_type *)local_f0._M_dataplus._M_p * 8 + 1);
    }
    else {
      *(int *)(local_f0._M_dataplus._M_p + 0x30) =
           (int)*(long *)(local_f0._M_dataplus._M_p + 0x30) + 1;
    }
  }
  local_b0._M_string_length = local_f0._M_string_length;
  write_array<signed_char,signed_char>
            (local_118,(string *)local_140,1,(Read<signed_char> *)&local_b0,SUB41(local_11c,0));
  _Var10._M_p = local_b0._M_dataplus._M_p;
  if (((ulong)local_b0._M_dataplus._M_p & 7) == 0 &&
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)0x0) {
    piVar2 = (int *)(local_b0._M_dataplus._M_p + 0x30);
    *piVar2 = *piVar2 + -1;
    if (*piVar2 == 0) {
      Alloc::~Alloc((Alloc *)_Var10._M_p);
      operator_delete(_Var10._M_p,0x48);
    }
  }
  if ((undefined1 *)local_140._0_8_ != local_140 + 0x10) {
    operator_delete((void *)local_140._0_8_,local_140._16_8_ + 1);
  }
  Omega_h::Mesh::ask_verts_of((Mesh *)local_d0,(Int)pMVar8);
  uVar25 = (uint)uVar32;
  if (pMVar8->family_ == OMEGA_H_SIMPLEX) {
    iVar12 = -1;
    if (uVar25 < 4) {
      iVar12 = uVar25 + 1;
    }
  }
  else {
    iVar12 = -1;
    if (uVar25 < 4) {
      iVar12 = *(int *)(&DAT_0044eba8 + uVar32 * 4);
    }
  }
  LVar13 = Omega_h::Mesh::nents(pMVar8,uVar25);
  local_140._8_8_ = 0;
  local_140._16_8_ = local_140._16_8_ & 0xffffffffffffff00;
  local_140._0_8_ = local_140 + 0x10;
  Read<int>::Read(&local_70,LVar13,iVar12,iVar12,(string *)local_140);
  if ((undefined1 *)local_140._0_8_ != local_140 + 0x10) {
    operator_delete((void *)local_140._0_8_,local_140._16_8_ + 1);
  }
  local_140._0_8_ = local_140 + 0x10;
  local_140._16_8_ = 0x697463656e6e6f63;
  local_140._8_8_ = 0xc;
  uStack_128 = 0x79746976;
  local_80.write_.shared_alloc_.alloc = (Alloc *)local_d0._0_8_;
  if ((local_d0._0_8_ & 7) == 0 && (Alloc *)local_d0._0_8_ != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_80.write_.shared_alloc_.alloc = (Alloc *)(*(size_t *)local_d0._0_8_ * 8 + 1);
    }
    else {
      *(int *)(local_d0._0_8_ + 0x30) = *(int *)(local_d0._0_8_ + 0x30) + 1;
    }
  }
  local_80.write_.shared_alloc_.direct_ptr = (void *)local_d0._8_8_;
  write_array<int,int>(local_118,(string *)local_140,1,&local_80,SUB41(local_11c,0));
  pAVar6 = local_80.write_.shared_alloc_.alloc;
  if (((ulong)local_80.write_.shared_alloc_.alloc & 7) == 0 &&
      local_80.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar2 = &(local_80.write_.shared_alloc_.alloc)->use_count;
    *piVar2 = *piVar2 + -1;
    if (*piVar2 == 0) {
      Alloc::~Alloc(pAVar6);
      operator_delete(pAVar6,0x48);
    }
  }
  if ((undefined1 *)local_140._0_8_ != local_140 + 0x10) {
    operator_delete((void *)local_140._0_8_,local_140._16_8_ + 1);
  }
  local_140._0_8_ = local_140 + 0x10;
  local_140._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x7;
  local_140._16_8_ = 0x7374657366666f;
  local_90.write_.shared_alloc_.alloc = local_70.write_.shared_alloc_.alloc;
  if (((ulong)local_70.write_.shared_alloc_.alloc & 7) == 0 &&
      local_70.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_90.write_.shared_alloc_.alloc =
           (Alloc *)((local_70.write_.shared_alloc_.alloc)->size * 8 + 1);
    }
    else {
      (local_70.write_.shared_alloc_.alloc)->use_count =
           (local_70.write_.shared_alloc_.alloc)->use_count + 1;
    }
  }
  local_90.write_.shared_alloc_.direct_ptr = local_70.write_.shared_alloc_.direct_ptr;
  write_array<int,int>(local_118,(string *)local_140,1,&local_90,SUB41(local_11c,0));
  pAVar6 = local_90.write_.shared_alloc_.alloc;
  if (((ulong)local_90.write_.shared_alloc_.alloc & 7) == 0 &&
      local_90.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar2 = &(local_90.write_.shared_alloc_.alloc)->use_count;
    *piVar2 = *piVar2 + -1;
    if (*piVar2 == 0) {
      Alloc::~Alloc(local_90.write_.shared_alloc_.alloc);
      operator_delete(pAVar6,0x48);
    }
  }
  if ((undefined1 *)local_140._0_8_ != local_140 + 0x10) {
    operator_delete((void *)local_140._0_8_,local_140._16_8_ + 1);
  }
  pAVar6 = local_70.write_.shared_alloc_.alloc;
  if (((ulong)local_70.write_.shared_alloc_.alloc & 7) == 0 &&
      local_70.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar2 = &(local_70.write_.shared_alloc_.alloc)->use_count;
    *piVar2 = *piVar2 + -1;
    if (*piVar2 == 0) {
      Alloc::~Alloc(local_70.write_.shared_alloc_.alloc);
      operator_delete(pAVar6,0x48);
    }
  }
  uVar29 = local_d0._0_8_;
  if ((local_d0._0_8_ & 7) == 0 && (Alloc *)local_d0._0_8_ != (Alloc *)0x0) {
    piVar2 = (int *)(local_d0._0_8_ + 0x30);
    *piVar2 = *piVar2 + -1;
    if (*piVar2 == 0) {
      Alloc::~Alloc((Alloc *)local_d0._0_8_);
      operator_delete((void *)uVar29,0x48);
    }
  }
  _Var10._M_p = local_f0._M_dataplus._M_p;
  if (((ulong)local_f0._M_dataplus._M_p & 7) == 0 &&
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)0x0) {
    piVar2 = (int *)(local_f0._M_dataplus._M_p + 0x30);
    *piVar2 = *piVar2 + -1;
    if (*piVar2 == 0) {
      Alloc::~Alloc((Alloc *)local_f0._M_dataplus._M_p);
      operator_delete(_Var10._M_p,0x48);
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>(local_118,"</Cells>\n",9);
  std::__ostream_insert<char,std::char_traits<char>>(local_118,"<Points>\n",9);
  Omega_h::Mesh::coords((Mesh *)&local_50);
  local_140._0_8_ = local_140 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_140,"coordinates","");
  local_60.write_.shared_alloc_.alloc = local_50;
  if (((ulong)local_50 & 7) == 0 && local_50 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_60.write_.shared_alloc_.alloc = (Alloc *)(local_50->size * 8 + 1);
    }
    else {
      local_50->use_count = local_50->use_count + 1;
    }
  }
  local_60.write_.shared_alloc_.direct_ptr = local_48;
  if (3 < (uint)pMVar8->dim_) {
    fail("assertion %s failed at %s +%d\n","0 <= dim_ && dim_ <= 3",
         "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_mesh.hpp"
         ,0x33);
  }
  resize_vectors((Omega_h *)&local_40,&local_60,pMVar8->dim_,3);
  write_array<double,double>(local_118,(string *)local_140,3,&local_40,SUB41(local_11c,0));
  if (((ulong)local_40.write_.shared_alloc_.alloc & 7) == 0 &&
      local_40.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    p_Var3 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
             ((long)local_40.write_.shared_alloc_.alloc + 0x30);
    *(int *)&p_Var3->_vptr__Sp_counted_base = *(int *)&p_Var3->_vptr__Sp_counted_base + -1;
    if (*(int *)&p_Var3->_vptr__Sp_counted_base == 0) {
      Alloc::~Alloc(local_40.write_.shared_alloc_.alloc);
      operator_delete(local_40.write_.shared_alloc_.alloc,0x48);
    }
  }
  pAVar6 = local_60.write_.shared_alloc_.alloc;
  if (((ulong)local_60.write_.shared_alloc_.alloc & 7) == 0 &&
      local_60.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar2 = &(local_60.write_.shared_alloc_.alloc)->use_count;
    *piVar2 = *piVar2 + -1;
    if (*piVar2 == 0) {
      Alloc::~Alloc(local_60.write_.shared_alloc_.alloc);
      operator_delete(pAVar6,0x48);
    }
  }
  if ((undefined1 *)local_140._0_8_ != local_140 + 0x10) {
    operator_delete((void *)local_140._0_8_,local_140._16_8_ + 1);
  }
  poVar20 = local_118;
  std::__ostream_insert<char,std::char_traits<char>>(local_118,"</Points>\n",10);
  std::__ostream_insert<char,std::char_traits<char>>(poVar20,"<PointData>\n",0xc);
  local_140._0_8_ = local_140 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_140,"global","");
  pMVar8 = local_100;
  bVar11 = Omega_h::Mesh::has_tag(local_100,0,(string *)local_140);
  pTVar9 = local_f8;
  if (bVar11) {
    local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"global","");
    cVar21 = std::
             _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)pTVar9,&local_f0);
    bVar11 = (_Rb_tree_header *)cVar21._M_node !=
             &pTVar9->_M_elems[0]._M_t._M_impl.super__Rb_tree_header;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
      operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    bVar11 = false;
  }
  if ((undefined1 *)local_140._0_8_ != local_140 + 0x10) {
    operator_delete((void *)local_140._0_8_,local_140._16_8_ + 1);
  }
  if (bVar11) {
    local_140._0_8_ = local_140 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_140,"global","");
    pTVar22 = Omega_h::Mesh::get_tag<long>(pMVar8,0,(string *)local_140);
    if (3 < (uint)pMVar8->dim_) {
      fail("assertion %s failed at %s +%d\n","0 <= dim_ && dim_ <= 3",
           "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_mesh.hpp"
           ,0x33);
    }
    write_tag(local_118,&pTVar22->super_TagBase,pMVar8->dim_,SUB41(local_11c,0));
    if ((undefined1 *)local_140._0_8_ != local_140 + 0x10) {
      operator_delete((void *)local_140._0_8_,local_140._16_8_ + 1);
    }
  }
  iVar12 = 0;
  write_locals_and_owners(local_118,pMVar8,0,local_f8,SUB41(local_11c,0));
  pMVar8 = local_100;
  psVar33 = local_f8->_M_elems;
  do {
    IVar14 = Omega_h::Mesh::ntags(pMVar8,0);
    poVar20 = local_118;
    if (IVar14 <= iVar12) {
      std::__ostream_insert<char,std::char_traits<char>>(local_118,"</PointData>\n",0xd);
      std::__ostream_insert<char,std::char_traits<char>>(poVar20,"<CellData>\n",0xb);
      local_140._0_8_ = local_140 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_140,"global","");
      pMVar8 = local_100;
      bVar11 = Omega_h::Mesh::has_tag(local_100,(Int)local_108,(string *)local_140);
      pTVar9 = local_f8;
      if (bVar11) {
        local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"global","");
        psVar33 = pTVar9->_M_elems + (int)local_108;
        cVar21 = std::
                 _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::find(&psVar33->_M_t,&local_b0);
        bVar11 = (_Rb_tree_header *)cVar21._M_node != &(psVar33->_M_t)._M_impl.super__Rb_tree_header
        ;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
          operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._0_8_ + 1);
        }
      }
      else {
        bVar11 = false;
      }
      if ((undefined1 *)local_140._0_8_ != local_140 + 0x10) {
        operator_delete((void *)local_140._0_8_,local_140._16_8_ + 1);
      }
      if (bVar11) {
        local_140._0_8_ = local_140 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_140,"global","");
        pTVar22 = Omega_h::Mesh::get_tag<long>(pMVar8,(Int)local_108,(string *)local_140);
        if (3 < (uint)pMVar8->dim_) {
          fail("assertion %s failed at %s +%d\n","0 <= dim_ && dim_ <= 3",
               "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_mesh.hpp"
               ,0x33);
        }
        write_tag(local_118,&pTVar22->super_TagBase,pMVar8->dim_,SUB41(local_11c,0));
        if ((undefined1 *)local_140._0_8_ != local_140 + 0x10) {
          operator_delete((void *)local_140._0_8_,local_140._16_8_ + 1);
        }
      }
      write_locals_and_owners(local_118,pMVar8,(Int)local_108,pTVar9,SUB41(local_11c,0));
      local_140._0_8_ = local_140 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_140,"vtkGhostType","");
      psVar33 = local_f8->_M_elems + (int)local_108;
      cVar21 = std::
               _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::find(&psVar33->_M_t,(key_type *)local_140);
      p_Var4 = &(psVar33->_M_t)._M_impl.super__Rb_tree_header;
      if ((Comm *)local_140._0_8_ != (Comm *)(local_140 + 0x10)) {
        operator_delete((void *)local_140._0_8_,local_140._16_8_ + 1);
      }
      if ((_Rb_tree_header *)cVar21._M_node != p_Var4) {
        Omega_h::Mesh::comm(local_100);
        IVar16 = Comm::size((Comm *)local_140._0_8_);
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_140._8_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_140._8_8_);
        }
        if (IVar16 != 1) {
          Omega_h::Mesh::owned((Mesh *)local_d0,(Int)local_100);
          local_80.write_.shared_alloc_.alloc = (Alloc *)local_d0._0_8_;
          if ((local_d0._0_8_ & 7) == 0 && (Alloc *)local_d0._0_8_ != (Alloc *)0x0) {
            if (entering_parallel == '\x01') {
              local_80.write_.shared_alloc_.alloc = (Alloc *)(*(size_t *)local_d0._0_8_ * 8 + 1);
            }
            else {
              *(int *)(local_d0._0_8_ + 0x30) = *(int *)(local_d0._0_8_ + 0x30) + 1;
            }
          }
          local_80.write_.shared_alloc_.direct_ptr = (void *)local_d0._8_8_;
          each_eq_to<signed_char>((Omega_h *)&local_70,(Read<signed_char> *)&local_80,'\0');
          pAVar6 = local_80.write_.shared_alloc_.alloc;
          if (((ulong)local_80.write_.shared_alloc_.alloc & 7) == 0 &&
              local_80.write_.shared_alloc_.alloc != (Alloc *)0x0) {
            piVar2 = &(local_80.write_.shared_alloc_.alloc)->use_count;
            *piVar2 = *piVar2 + -1;
            if (*piVar2 == 0) {
              Alloc::~Alloc(pAVar6);
              operator_delete(pAVar6,0x48);
            }
          }
          local_140._0_8_ = local_140 + 0x10;
          local_140._16_8_ = 0x74736f68476b7476;
          local_140._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0xc;
          uStack_128 = 0x65707954;
          local_90.write_.shared_alloc_.alloc = local_70.write_.shared_alloc_.alloc;
          if (((ulong)local_70.write_.shared_alloc_.alloc & 7) == 0 &&
              local_70.write_.shared_alloc_.alloc != (Alloc *)0x0) {
            if (entering_parallel == '\x01') {
              local_90.write_.shared_alloc_.alloc =
                   (Alloc *)((local_70.write_.shared_alloc_.alloc)->size * 8 + 1);
            }
            else {
              (local_70.write_.shared_alloc_.alloc)->use_count =
                   (local_70.write_.shared_alloc_.alloc)->use_count + 1;
            }
          }
          local_90.write_.shared_alloc_.direct_ptr = local_70.write_.shared_alloc_.direct_ptr;
          write_array<signed_char,unsigned_char>
                    (local_118,(string *)local_140,1,(Read<signed_char> *)&local_90,
                     SUB41(local_11c,0));
          pAVar6 = local_90.write_.shared_alloc_.alloc;
          if (((ulong)local_90.write_.shared_alloc_.alloc & 7) == 0 &&
              local_90.write_.shared_alloc_.alloc != (Alloc *)0x0) {
            piVar2 = &(local_90.write_.shared_alloc_.alloc)->use_count;
            *piVar2 = *piVar2 + -1;
            if (*piVar2 == 0) {
              Alloc::~Alloc(local_90.write_.shared_alloc_.alloc);
              operator_delete(pAVar6,0x48);
            }
          }
          if ((Comm *)local_140._0_8_ != (Comm *)(local_140 + 0x10)) {
            operator_delete((void *)local_140._0_8_,local_140._16_8_ + 1);
          }
          if (((ulong)local_70.write_.shared_alloc_.alloc & 7) == 0 &&
              local_70.write_.shared_alloc_.alloc != (Alloc *)0x0) {
            piVar2 = &(local_70.write_.shared_alloc_.alloc)->use_count;
            *piVar2 = *piVar2 + -1;
            if (*piVar2 == 0) {
              Alloc::~Alloc(local_70.write_.shared_alloc_.alloc);
              operator_delete(local_70.write_.shared_alloc_.alloc,0x48);
            }
          }
          uVar29 = local_d0._0_8_;
          if ((local_d0._0_8_ & 7) == 0 && (Alloc *)local_d0._0_8_ != (Alloc *)0x0) {
            piVar2 = (int *)(local_d0._0_8_ + 0x30);
            *piVar2 = *piVar2 + -1;
            if (*piVar2 == 0) {
              Alloc::~Alloc((Alloc *)local_d0._0_8_);
              operator_delete((void *)uVar29,0x48);
            }
          }
        }
      }
      iVar12 = 0;
      do {
        pMVar8 = local_100;
        IVar14 = Omega_h::Mesh::ntags(local_100,(Int)local_108);
        poVar20 = local_118;
        if (IVar14 <= iVar12) {
          std::__ostream_insert<char,std::char_traits<char>>(local_118,"</CellData>\n",0xc);
          std::__ostream_insert<char,std::char_traits<char>>(poVar20,"</Piece>\n",9);
          std::__ostream_insert<char,std::char_traits<char>>(poVar20,"</UnstructuredGrid>\n",0x14);
          std::__ostream_insert<char,std::char_traits<char>>(poVar20,"</VTKFile>\n",0xb);
          if (((ulong)local_50 & 7) == 0 && local_50 != (Alloc *)0x0) {
            piVar2 = &local_50->use_count;
            *piVar2 = *piVar2 + -1;
            if (*piVar2 == 0) {
              Alloc::~Alloc(local_50);
              operator_delete(local_50,0x48);
            }
          }
          ScopedTimer::~ScopedTimer(&local_109);
          return;
        }
        pTVar23 = Omega_h::Mesh::get_tag(pMVar8,(Int)local_108,iVar12);
        psVar24 = TagBase::name_abi_cxx11_(pTVar23);
        iVar15 = std::__cxx11::string::compare((char *)psVar24);
        if (iVar15 != 0) {
          psVar24 = TagBase::name_abi_cxx11_(pTVar23);
          cVar21 = std::
                   _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::find(&psVar33->_M_t,psVar24);
          if ((_Rb_tree_header *)cVar21._M_node != p_Var4) {
            if (3 < (uint)local_100->dim_) {
              fail("assertion %s failed at %s +%d\n","0 <= dim_ && dim_ <= 3",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_mesh.hpp"
                   ,0x33);
            }
            write_tag(local_118,pTVar23,local_100->dim_,SUB41(local_11c,0));
          }
        }
        iVar12 = iVar12 + 1;
      } while( true );
    }
    pTVar23 = Omega_h::Mesh::get_tag(pMVar8,0,iVar12);
    psVar24 = TagBase::name_abi_cxx11_(pTVar23);
    iVar15 = std::__cxx11::string::compare((char *)psVar24);
    if (iVar15 != 0) {
      psVar24 = TagBase::name_abi_cxx11_(pTVar23);
      iVar15 = std::__cxx11::string::compare((char *)psVar24);
      if (iVar15 != 0) {
        psVar24 = TagBase::name_abi_cxx11_(pTVar23);
        cVar21 = std::
                 _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)local_f8,psVar24);
        if ((_Rb_tree_header *)cVar21._M_node != &(psVar33->_M_t)._M_impl.super__Rb_tree_header) {
          if (3 < (uint)pMVar8->dim_) {
            fail("assertion %s failed at %s +%d\n","0 <= dim_ && dim_ <= 3",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_mesh.hpp"
                 ,0x33);
          }
          write_tag(local_118,pTVar23,pMVar8->dim_,SUB41(local_11c,0));
        }
      }
    }
    iVar12 = iVar12 + 1;
  } while( true );
}

Assistant:

void write_vtu(std::ostream& stream, Mesh* mesh, Int cell_dim,
    TagSet const& tags, bool compress) {
  OMEGA_H_TIME_FUNCTION;
  default_dim(mesh, &cell_dim);
  verify_vtk_tagset(mesh, cell_dim, tags);
  write_vtkfile_vtu_start_tag(stream, compress);
  stream << "<UnstructuredGrid>\n";
  write_piece_start_tag(stream, mesh, cell_dim);
  stream << "<Cells>\n";
  write_connectivity(stream, mesh, cell_dim, compress);
  stream << "</Cells>\n";
  stream << "<Points>\n";
  auto coords = mesh->coords();
  write_array(stream, "coordinates", 3, resize_vectors(coords, mesh->dim(), 3),
      compress);
  stream << "</Points>\n";
  stream << "<PointData>\n";
  /* globals go first so read_vtu() knows where to find them */
  if (mesh->has_tag(VERT, "global") && tags[VERT].count("global")) {
    write_tag(stream, mesh->get_tag<GO>(VERT, "global"), mesh->dim(), compress);
  }
  write_locals_and_owners(stream, mesh, VERT, tags, compress);
  for (Int i = 0; i < mesh->ntags(VERT); ++i) {
    auto tag = mesh->get_tag(VERT, i);
    if (tag->name() != "coordinates" && tag->name() != "global" &&
        tags[VERT].count(tag->name())) {
      write_tag(stream, tag, mesh->dim(), compress);
    }
  }
  stream << "</PointData>\n";
  stream << "<CellData>\n";
  /* globals go first so read_vtu() knows where to find them */
  if (mesh->has_tag(cell_dim, "global") &&
      tags[size_t(cell_dim)].count("global")) {
    write_tag(
        stream, mesh->get_tag<GO>(cell_dim, "global"), mesh->dim(), compress);
  }
  write_locals_and_owners(stream, mesh, cell_dim, tags, compress);
  if (tags[size_t(cell_dim)].count("vtkGhostType")) {
    write_vtk_ghost_types(stream, mesh, cell_dim, compress);
  }
  for (Int i = 0; i < mesh->ntags(cell_dim); ++i) {
    auto tag = mesh->get_tag(cell_dim, i);
    if (tag->name() != "global" && tags[size_t(cell_dim)].count(tag->name())) {
      write_tag(stream, tag, mesh->dim(), compress);
    }
  }
  stream << "</CellData>\n";
  stream << "</Piece>\n";
  stream << "</UnstructuredGrid>\n";
  stream << "</VTKFile>\n";
}